

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.h
# Opt level: O0

bool __thiscall TcpServer::start(TcpServer *this)

{
  bool bVar1;
  int iVar2;
  undefined1 local_28 [8];
  epoll_event event;
  int reuse;
  TcpServer *this_local;
  
  if ((this->readyForStart & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    unique0x1000044d = this;
    bVar1 = ignoreSignal(this);
    if (bVar1) {
      event.data.fd = 1;
      iVar2 = socket(2,1,6);
      this->serverFd = iVar2;
      if (iVar2 == -1) {
        recordError(this,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                    ,0xa6);
        this_local._7_1_ = false;
      }
      else {
        iVar2 = setsockopt(this->serverFd,1,2,&event.data,4);
        if (iVar2 < 0) {
          recordError(this,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                      ,0xab);
          this_local._7_1_ = false;
        }
        else {
          bVar1 = setNoBlock(this,this->serverFd);
          if (bVar1) {
            iVar2 = bind(this->serverFd,(sockaddr *)this,0x10);
            if (iVar2 < 0) {
              recordError(this,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                          ,0xb3);
              this_local._7_1_ = false;
            }
            else {
              iVar2 = listen(this->serverFd,0x400);
              if (iVar2 < 0) {
                recordError(this,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                            ,0xb7);
                this_local._7_1_ = false;
              }
              else {
                iVar2 = epoll_create1(0);
                this->epollFd = iVar2;
                if (iVar2 == -1) {
                  recordError(this,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                              ,0xbb);
                  close(this->serverFd);
                  this_local._7_1_ = false;
                }
                else {
                  local_28._0_4_ = 1;
                  local_28._4_4_ = this->serverFd;
                  iVar2 = epoll_ctl(this->epollFd,1,this->serverFd,(epoll_event *)local_28);
                  if (iVar2 == -1) {
                    recordError(this,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                                ,0xc3);
                    close(this->serverFd);
                    close(this->epollFd);
                    this_local._7_1_ = false;
                  }
                  else {
                    iVar2 = pipe(this->pipeFds);
                    if (iVar2 == -1) {
                      recordError(this,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                                  ,0xc9);
                      close(this->serverFd);
                      close(this->epollFd);
                      this_local._7_1_ = false;
                    }
                    else {
                      bVar1 = setNoBlock(this,this->pipeFds[0]);
                      if (bVar1) {
                        bVar1 = setNoBlock(this,this->pipeFds[1]);
                        if (bVar1) {
                          local_28._4_4_ = this->pipeFds[0];
                          iVar2 = epoll_ctl(this->epollFd,1,this->pipeFds[0],(epoll_event *)local_28
                                           );
                          if (iVar2 == -1) {
                            recordError(this,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                                        ,0xe0);
                            close(this->serverFd);
                            close(this->epollFd);
                            this_local._7_1_ = false;
                          }
                          else {
                            this_local._7_1_ = true;
                          }
                        }
                        else {
                          recordError(this,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                                      ,0xd7);
                          close(this->serverFd);
                          close(this->epollFd);
                          close(this->pipeFds[0]);
                          close(this->pipeFds[1]);
                          this_local._7_1_ = false;
                        }
                      }
                      else {
                        recordError(this,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                                    ,0xcf);
                        close(this->serverFd);
                        close(this->epollFd);
                        close(this->pipeFds[0]);
                        close(this->pipeFds[1]);
                        this_local._7_1_ = false;
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool start() {
    if (!readyForStart) {
      return false;
    }
    if (!ignoreSignal()) {  // 忽略SIG_PIPE
      return false;
    }
    int reuse = 1;
    if ((serverFd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP)) == -1) {
      recordError(__FILE__, __LINE__);
      return false;
    }
    if (setsockopt(serverFd, SOL_SOCKET, SO_REUSEADDR, &reuse, sizeof(int)) <
        0) {
      recordError(__FILE__, __LINE__);
      return false;
    }
    if (!setNoBlock(serverFd)) {
      return false;
    }
    if (bind(serverFd, reinterpret_cast<sockaddr *>(&address),
             sizeof(address)) < 0) { /* bind socket fd to address addr */
      recordError(__FILE__, __LINE__);
      return false;
    }
    if (listen(serverFd, 1024) < 0) {
      recordError(__FILE__, __LINE__);
      return false;
    }
    if ((epollFd = epoll_create1(0)) == -1) {
      recordError(__FILE__, __LINE__);
      close(serverFd);
      return false;
    }
    struct epoll_event event;
    event.events = EPOLLIN;
    event.data.fd = serverFd;
    if (epoll_ctl(epollFd, EPOLL_CTL_ADD, serverFd, &event) == -1) {
      recordError(__FILE__, __LINE__);
      close(serverFd);
      close(epollFd);
      return false;
    }
    if (pipe(pipeFds) == -1) {
      recordError(__FILE__, __LINE__);
      close(serverFd);
      close(epollFd);
      return false;
    }
    if (!setNoBlock(pipeFds[0])) {
      recordError(__FILE__, __LINE__);
      close(serverFd);
      close(epollFd);
      close(pipeFds[0]);
      close(pipeFds[1]);
      return false;
    }
    if (!setNoBlock(pipeFds[1])) {
      recordError(__FILE__, __LINE__);
      close(serverFd);
      close(epollFd);
      close(pipeFds[0]);
      close(pipeFds[1]);
      return false;
    }
    event.data.fd = pipeFds[0];
    if (epoll_ctl(epollFd, EPOLL_CTL_ADD, pipeFds[0], &event) == -1) {
      recordError(__FILE__, __LINE__);
      close(serverFd);
      close(epollFd);
      return false;
    }
    return true;
  }